

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall StandardOutput::StandardOutput(StandardOutput *this)

{
  int iVar1;
  char *__s1;
  bool bVar2;
  
  (this->super_Output)._vptr_Output = (_func_int **)&PTR__Output_0018b830;
  iVar1 = fileno(_stdout);
  iVar1 = isatty(iVar1);
  this->istty = iVar1 != 0;
  __s1 = getenv("TERM");
  if (__s1 == (char *)0x0 || iVar1 == 0) {
    bVar2 = false;
  }
  else {
    iVar1 = strcmp(__s1,"dumb");
    bVar2 = iVar1 != 0;
  }
  this->istty = bVar2;
  return;
}

Assistant:

StandardOutput()
	{
		istty = isatty(fileno(stdout)) != 0;

	#ifndef _WIN32
		const char* term = getenv("TERM");

		istty = istty && term && strcmp(term, "dumb") != 0;
	#endif

	#ifdef _WIN32
		if (istty)
			SetConsoleOutputCP(CP_UTF8);
	#endif
	}